

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O1

void __thiscall
spdlog::details::pid_formatter<spdlog::details::null_scoped_padder>::format
          (pid_formatter<spdlog::details::null_scoped_padder> *this,log_msg *param_1,tm *param_2,
          memory_buf_t *dest)

{
  uint32_or_64_or_128_t<unsigned_int> n;
  uint value;
  long lVar1;
  format_decimal_result<char_*> fVar2;
  char local_30 [21];
  char acStack_1b [3];
  char *local_18;
  
  value = getpid();
  fVar2 = ::fmt::v9::detail::format_decimal<char,unsigned_int>(local_30,value,0x15);
  local_18 = fVar2.begin;
  lVar1 = (long)local_30 - (long)local_18;
  if (-0x16 < lVar1) {
    ::fmt::v9::detail::buffer<char>::append<char>
              (&dest->super_buffer<char>,local_18,local_18 + lVar1 + 0x15);
    return;
  }
  ::fmt::v9::detail::assert_fail
            ("/workspace/llm4binary/github/license_c_cmakelists/rezalas[P]riftshadow/code/include/spdlog/fmt/bundled/core.h"
             ,0x199,"negative value");
}

Assistant:

void format(const details::log_msg &, const std::tm &, memory_buf_t &dest) override {
        const auto pid = static_cast<uint32_t>(details::os::pid());
        auto field_size = ScopedPadder::count_digits(pid);
        ScopedPadder p(field_size, padinfo_, dest);
        fmt_helper::append_int(pid, dest);
    }